

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

StateSet *
Omega_h::get_epsilon_closure(StateSet *__return_storage_ptr__,StateSet *ss,FiniteAutomaton *fa)

{
  int state_00;
  StateSet *pSVar1;
  int iVar2;
  _Rb_tree_header *p_Var3;
  size_type sVar4;
  int epsilon;
  int symbol;
  StateSet *__range1;
  int state;
  StateQueue q;
  int local_98;
  int local_94;
  _Rb_tree_header *local_90;
  StateSet *local_88;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  local_88 = __return_storage_ptr__;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  local_90 = &(ss->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var3 = (_Rb_tree_header *)(ss->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 != local_90; p_Var3 = (_Rb_tree_header *)std::_Rb_tree_increment(&p_Var3->_M_header)) {
    local_98 = (int)p_Var3->_M_node_count;
    std::deque<int,_std::allocator<int>_>::push_back
              ((deque<int,_std::allocator<int>_> *)&local_80,&local_98);
  }
  local_94 = get_epsilon0(fa);
  iVar2 = get_epsilon1(fa);
  while (pSVar1 = local_88,
        local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    state_00 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
    for (symbol = local_94; symbol <= iVar2; symbol = symbol + 1) {
      local_98 = step(fa,state_00,symbol);
      if (local_98 != -1) {
        sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(ss,&local_98);
        if (sVar4 == 0) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)ss,
                     &local_98);
          std::deque<int,_std::allocator<int>_>::push_back
                    ((deque<int,_std::allocator<int>_> *)&local_80,&local_98);
        }
      }
    }
  }
  std::_Rb_tree_header::_Rb_tree_header(&(local_88->_M_t)._M_impl.super__Rb_tree_header,local_90);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
  return pSVar1;
}

Assistant:

static StateSet get_epsilon_closure(StateSet ss, FiniteAutomaton const& fa) {
  StateQueue q;
  for (auto state : ss) q.push(state);
  auto epsilon0 = get_epsilon0(fa);
  auto epsilon1 = get_epsilon1(fa);
  while (!q.empty()) {
    auto state = q.front();
    q.pop();
    for (auto epsilon = epsilon0; epsilon <= epsilon1; ++epsilon) {
      auto next_state = step(fa, state, epsilon);
      if (next_state == -1) continue;
      if (!ss.count(next_state)) {
        ss.insert(next_state);
        q.push(next_state);
      }
    }
  }
  return ss;
}